

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_key_unserialize_alloc(uchar *bytes,size_t bytes_len,ext_key **output)

{
  ext_key *peVar1;
  int ret;
  ext_key **output_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (output == (ext_key **)0x0) {
    bytes_local._4_4_ = -2;
  }
  else {
    peVar1 = (ext_key *)wally_calloc(0xc0);
    *output = peVar1;
    if (*output == (ext_key *)0x0) {
      bytes_local._4_4_ = -3;
    }
    else {
      bytes_local._4_4_ = bip32_key_unserialize(bytes,bytes_len,*output);
      if (bytes_local._4_4_ != 0) {
        wally_free(*output);
        *output = (ext_key *)0x0;
      }
    }
  }
  return bytes_local._4_4_;
}

Assistant:

int bip32_key_unserialize_alloc(const unsigned char *bytes, size_t bytes_len,
                                struct ext_key **output)
{
    int ret;

    ALLOC_KEY();
    ret = bip32_key_unserialize(bytes, bytes_len, *output);
    if (ret != WALLY_OK) {
        wally_free(*output);
        *output = NULL;
    }
    return ret;
}